

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_map(mg_session *session,mg_map **map)

{
  int iVar1;
  mg_session *session_00;
  mg_session *in_RSI;
  mg_session *in_RDI;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t values_read;
  uint32_t keys_read;
  int status;
  mg_map *tmap;
  int status_1;
  uint32_t size;
  mg_allocator *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar2;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffd4;
  uint8_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  int local_4;
  
  local_4 = mg_session_read_container_size
                      (in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8);
  if (local_4 == 0) {
    session_00 = (mg_session *)
                 mg_map_alloc((uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                              (mg_allocator *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (session_00 == (mg_session *)0x0) {
      mg_session_set_error(in_RDI,"out of memory");
      local_4 = -3;
    }
    else {
      session_00->status = in_stack_ffffffffffffffe4;
      uVar4 = 0;
      uVar3 = 0;
      for (uVar2 = 0; uVar2 < in_stack_ffffffffffffffe4; uVar2 = uVar2 + 1) {
        iVar1 = mg_session_read_string
                          ((mg_session *)CONCAT44(uVar3,uVar2),
                           (mg_string **)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        if (iVar1 != 0) {
LAB_00108c5b:
          for (uVar2 = 0; uVar2 < uVar4; uVar2 = uVar2 + 1) {
            mg_string_destroy_ca
                      ((mg_string *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
          }
          for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            mg_value_destroy_ca((mg_value *)CONCAT44(uVar2,uVar4),in_stack_ffffffffffffffb8);
          }
          mg_allocator_free((mg_allocator *)CONCAT44(uVar2,uVar4),in_stack_ffffffffffffffb8);
          return iVar1;
        }
        uVar4 = uVar4 + 1;
        iVar1 = mg_session_read_value(session_00,(mg_value **)(ulong)uVar4);
        if (iVar1 != 0) goto LAB_00108c5b;
        uVar3 = uVar3 + 1;
      }
      *(mg_session **)in_RSI = session_00;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mg_session_read_map(mg_session *session, mg_map **map) {
  uint32_t size;
  MG_RETURN_IF_FAILED(
      mg_session_read_container_size(session, &size, MG_MARKERS_MAP));

  mg_map *tmap = mg_map_alloc(size, session->decoder_allocator);
  if (!tmap) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;

  tmap->size = size;

  uint32_t keys_read = 0;
  uint32_t values_read = 0;
  for (uint32_t i = 0; i < size; ++i) {
    status = mg_session_read_string(session, &tmap->keys[i]);
    if (status != 0) {
      goto cleanup;
    }
    keys_read++;
    status = mg_session_read_value(session, &tmap->values[i]);
    if (status != 0) {
      goto cleanup;
    }
    values_read++;
  }

  *map = tmap;
  return 0;

cleanup:
  for (uint32_t i = 0; i < keys_read; ++i) {
    mg_string_destroy_ca(tmap->keys[i], session->decoder_allocator);
  }
  for (uint32_t i = 0; i < values_read; ++i) {
    mg_value_destroy_ca(tmap->values[i], session->decoder_allocator);
  }
  mg_allocator_free(session->decoder_allocator, tmap);
  return status;
}